

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

ctl_named_node_t * arena_i_index(tsdn_t *tsdn,size_t *mib,size_t miblen,size_t i)

{
  int iVar1;
  ctl_named_node_t *pcVar2;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  if (iVar1 != 0) {
    malloc_mutex_lock_slow(&ctl_mtx);
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (ctl_mtx.field_0.field_0.prof_data.prev_owner != tsdn) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = tsdn;
  }
  if (((i & 0xfffffffffffffffe) == 0x1000) || (i <= ctl_arenas->narenas)) {
    pcVar2 = super_arena_i_node;
  }
  else {
    pcVar2 = (ctl_named_node_t *)0x0;
  }
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  return pcVar2;
}

Assistant:

static const ctl_named_node_t *
arena_i_index(tsdn_t *tsdn, const size_t *mib, size_t miblen,
    size_t i) {
	const ctl_named_node_t *ret;

	malloc_mutex_lock(tsdn, &ctl_mtx);
	switch (i) {
	case MALLCTL_ARENAS_ALL:
	case MALLCTL_ARENAS_DESTROYED:
		break;
	default:
		if (i > ctl_arenas->narenas) {
			ret = NULL;
			goto label_return;
		}
		break;
	}

	ret = super_arena_i_node;
label_return:
	malloc_mutex_unlock(tsdn, &ctl_mtx);
	return ret;
}